

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

void leveldb::PutVarint64(string *dst,uint64_t v)

{
  bool bVar1;
  uint64_t uVar2;
  byte *pbVar3;
  long in_FS_OFFSET;
  char buf [10];
  byte local_12 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = local_12;
  if (0x7f < v) {
    pbVar3 = local_12;
    uVar2 = v;
    do {
      *pbVar3 = (byte)uVar2 | 0x80;
      pbVar3 = pbVar3 + 1;
      v = uVar2 >> 7;
      bVar1 = 0x3fff < uVar2;
      uVar2 = v;
    } while (bVar1);
  }
  *pbVar3 = (byte)v;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (dst,(char *)local_12,(size_type)(pbVar3 + (1 - (long)local_12)));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PutVarint64(std::string* dst, uint64_t v) {
  char buf[10];
  char* ptr = EncodeVarint64(buf, v);
  dst->append(buf, ptr - buf);
}